

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest11<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section10ValidPolicyMappingTest11
          (Section10ValidPolicyMappingTest11<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest11) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "GoodsubCAPanyPolicyMapping1to2CACert",
                               "ValidPolicyMappingTest11EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL",
                              "GoodsubCAPanyPolicyMapping1to2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.11";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}